

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::ClockingBlockSymbol::ClockingBlockSymbol
          (ClockingBlockSymbol *this,Compilation *compilation,string_view name,SourceLocation loc)

{
  string_view name_00;
  Scope *in_RCX;
  Compilation *in_RDX;
  Symbol *in_RDI;
  SourceLocation in_R8;
  
  name_00._M_str = (char *)in_RCX;
  name_00._M_len = (size_t)in_RDX;
  Symbol::Symbol(in_RDI,ClockingBlock,name_00,in_R8);
  Scope::Scope(in_RCX,in_RDX,(Symbol *)in_R8);
  in_RDI[1].originatingSyntax = (SyntaxNode *)0x0;
  std::optional<slang::ast::ClockingSkew>::optional((optional<slang::ast::ClockingSkew> *)0x4698aa);
  std::optional<slang::ast::ClockingSkew>::optional((optional<slang::ast::ClockingSkew> *)0x4698ba);
  *(undefined8 *)&in_RDI[2].indexInScope = 0;
  in_RDI[2].originatingSyntax = (SyntaxNode *)0x0;
  return;
}

Assistant:

ClockingBlockSymbol::ClockingBlockSymbol(Compilation& compilation, std::string_view name,
                                         SourceLocation loc) :
    Symbol(SymbolKind::ClockingBlock, name, loc), Scope(compilation, this) {
}